

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall cmCPackArchiveGenerator::PackageFiles(cmCPackArchiveGenerator *this)

{
  string *newdir;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ComponentPackageMethod CVar2;
  Compress c;
  cmCPackLog *pcVar3;
  pointer pbVar4;
  _Alloc_hider _Var5;
  long *msg;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ostream *poVar10;
  size_t sVar11;
  char *__s;
  pointer pbVar12;
  cmWorkingDirectory workdir;
  string rp;
  ostringstream cmCPackLog_msg_1;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  cmWorkingDirectory local_578;
  string local_550;
  long *local_530;
  long local_528;
  long local_520 [2];
  string local_510;
  undefined1 local_4f0 [16];
  _func_int *local_4e0 [12];
  ios_base local_480 [264];
  undefined1 local_378 [64];
  _Alloc_hider local_338;
  size_type local_330;
  undefined1 local_298 [616];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"Toplevel: ",10);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,(this->super_cmCPackGenerator).toplevel._M_dataplus._M_p
                       ,(this->super_cmCPackGenerator).toplevel._M_string_length);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  pcVar3 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar6 = local_4f0._0_8_;
  sVar11 = strlen((char *)local_4f0._0_8_);
  cmCPackLog::Log(pcVar3,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x12a,(char *)uVar6,sVar11);
  if ((_func_int **)local_4f0._0_8_ != local_4e0) {
    operator_delete((void *)local_4f0._0_8_,(ulong)(local_4e0[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
  std::ios_base::~ios_base((ios_base *)(local_298 + 0x70));
  iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x19])(this);
  if ((char)iVar8 != '\0') {
    CVar2 = (this->super_cmCPackGenerator).componentPackageMethod;
    if (CVar2 != ONE_PACKAGE) {
      uVar9 = PackageComponents(this,CVar2 == ONE_PACKAGE_PER_COMPONENT);
      return uVar9;
    }
    uVar9 = PackageComponentsAllInOne(this);
    return uVar9;
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)local_298,
             (this->super_cmCPackGenerator).packageFileNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,false,true);
  iVar8 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,local_298);
  if (iVar8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f0,"Problem to generate Header for archive <",0x28);
    pbVar12 = (this->super_cmCPackGenerator).packageFileNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f0,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,">.",2);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar6 = local_378._0_8_;
    sVar11 = strlen((char *)local_378._0_8_);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x13c,(char *)uVar6,sVar11);
    if ((ostream *)local_378._0_8_ != (ostream *)(local_378 + 0x10)) {
      operator_delete((void *)local_378._0_8_,(ulong)((long)(uint *)local_378._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
    std::ios_base::~ios_base(local_480);
    uVar9 = 0;
    goto LAB_0019c6d1;
  }
  c = this->Compress;
  iVar8 = GetThreadCount(this);
  cmArchiveWrite::cmArchiveWrite
            ((cmArchiveWrite *)local_378,(ostream *)local_298,c,&this->ArchiveFormat,0,iVar8);
  bVar7 = cmArchiveWrite::Open((cmArchiveWrite *)local_378);
  if (bVar7) {
    if (local_330 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4f0,"Problem to create archive <",0x1b);
      pbVar12 = (this->super_cmCPackGenerator).packageFileNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f0,(pbVar12->_M_dataplus)._M_p,
                           pbVar12->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,">, ERROR = ",0xb);
      paVar1 = &local_578.OldDir.field_2;
      local_578.OldDir._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,local_338._M_p,local_338._M_p + local_330);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_578.OldDir._M_dataplus._M_p,
                           local_578.OldDir._M_string_length);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578.OldDir._M_dataplus._M_p != paVar1) {
        operator_delete(local_578.OldDir._M_dataplus._M_p,
                        local_578.OldDir.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_578.OldDir._M_dataplus._M_p;
      sVar11 = strlen(local_578.OldDir._M_dataplus._M_p);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x13c,_Var5._M_p,sVar11);
      goto LAB_0019c68b;
    }
    newdir = &(this->super_cmCPackGenerator).toplevel;
    cmWorkingDirectory::cmWorkingDirectory(&local_578,newdir);
    if (local_578.ResultCode == 0) {
      pbVar12 = (this->super_cmCPackGenerator).files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (this->super_cmCPackGenerator).files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar7 = pbVar12 == pbVar4;
      if (!bVar7) {
        do {
          cmSystemTools::RelativePath(&local_550,newdir,pbVar12);
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_510,local_550._M_dataplus._M_p,
                     local_550._M_dataplus._M_p + local_550._M_string_length);
          cmArchiveWrite::Add((cmArchiveWrite *)local_378,&local_510,0,(char *)0x0,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
          if (local_330 != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4f0,"Problem while adding file <",0x1b);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4f0,(pbVar12->_M_dataplus)._M_p,
                                 pbVar12->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"> to archive <",0xe);
            pbVar12 = (this->super_cmCPackGenerator).packageFileNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,">, ERROR = ",0xb);
            local_530 = local_520;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_530,local_338._M_p,local_338._M_p + local_330);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(char *)local_530,local_528);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if (local_530 != local_520) {
              operator_delete(local_530,local_520[0] + 1);
            }
            pcVar3 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            msg = local_530;
            sVar11 = strlen((char *)local_530);
            cmCPackLog::Log(pcVar3,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x14d,(char *)msg,sVar11);
            if (local_530 != local_520) {
              operator_delete(local_530,local_520[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
            std::ios_base::~ios_base(local_480);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._M_dataplus._M_p != &local_550.field_2) {
              operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1
                             );
            }
            break;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._M_dataplus._M_p != &local_550.field_2) {
            operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
          }
          pbVar12 = pbVar12 + 1;
          bVar7 = pbVar12 == pbVar4;
        } while (!bVar7);
      }
      uVar9 = (uint)bVar7;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4f0,"Failed to change working directory to ",0x26);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4f0,
                           (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                           (this->super_cmCPackGenerator).toplevel._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," : ",3);
      __s = strerror(local_578.ResultCode);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
      }
      else {
        sVar11 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
      }
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pcVar3 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var5._M_p = local_550._M_dataplus._M_p;
      sVar11 = strlen(local_550._M_dataplus._M_p);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x142,_Var5._M_p,sVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
      std::ios_base::~ios_base(local_480);
      uVar9 = 0;
    }
    cmWorkingDirectory::~cmWorkingDirectory(&local_578);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4f0,"Problem to open archive <",0x19);
    pbVar12 = (this->super_cmCPackGenerator).packageFileNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4f0,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,">, ERROR = ",0xb);
    paVar1 = &local_578.OldDir.field_2;
    local_578.OldDir._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_578,local_338._M_p,local_338._M_p + local_330);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_578.OldDir._M_dataplus._M_p,local_578.OldDir._M_string_length
                        );
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578.OldDir._M_dataplus._M_p != paVar1) {
      operator_delete(local_578.OldDir._M_dataplus._M_p,
                      local_578.OldDir.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var5._M_p = local_578.OldDir._M_dataplus._M_p;
    sVar11 = strlen(local_578.OldDir._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x13c,_Var5._M_p,sVar11);
LAB_0019c68b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578.OldDir._M_dataplus._M_p != &local_578.OldDir.field_2) {
      operator_delete(local_578.OldDir._M_dataplus._M_p,
                      local_578.OldDir.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
    std::ios_base::~ios_base(local_480);
    uVar9 = 0;
  }
  cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_378);
LAB_0019c6d1:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  return uVar9;
}

Assistant:

int cmCPackArchiveGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Toplevel: " << this->toplevel << std::endl);

  if (this->WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (this->componentPackageMethod == ONE_PACKAGE) {
      return this->PackageComponentsAllInOne();
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return this->PackageComponents(this->componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
  }

  // CASE 3 : NON COMPONENT package.
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);
  cmWorkingDirectory workdir(this->toplevel);
  if (workdir.Failed()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Failed to change working directory to "
                    << this->toplevel << " : "
                    << std::strerror(workdir.GetLastResult()) << std::endl);
    return 0;
  }
  for (std::string const& file : this->files) {
    // Get the relative path to the file
    std::string rp = cmSystemTools::RelativePath(this->toplevel, file);
    archive.Add(rp, 0, nullptr, false);
    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem while adding file <"
                      << file << "> to archive <" << this->packageFileNames[0]
                      << ">, ERROR = " << archive.GetError() << std::endl);
      return 0;
    }
  }
  // The destructor of cmArchiveWrite will close and finish the write
  return 1;
}